

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SquareMatrix3.hpp
# Opt level: O2

SquareMatrix3<double> *
OpenMD::operator*(SquareMatrix3<double> *__return_storage_ptr__,SquareMatrix3<double> *m1,
                 SquareMatrix3<double> *m2)

{
  double *pdVar1;
  uint i;
  long lVar2;
  double (*padVar3) [3];
  long lVar4;
  double (*padVar5) [3];
  uint k;
  long lVar6;
  double dVar7;
  
  SquareMatrix<double,_3>::SquareMatrix(&__return_storage_ptr__->super_SquareMatrix<double,_3>);
  for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
    padVar3 = (double (*) [3])m2;
    for (lVar4 = 0; lVar4 != 3; lVar4 = lVar4 + 1) {
      pdVar1 = (__return_storage_ptr__->super_SquareMatrix<double,_3>).
               super_RectMatrix<double,_3U,_3U>.data_[lVar2] + lVar4;
      dVar7 = *pdVar1;
      padVar5 = padVar3;
      for (lVar6 = 0; lVar6 != 3; lVar6 = lVar6 + 1) {
        dVar7 = dVar7 + (((SquareMatrix<double,_3> *)*(double (*) [3])m1)->
                        super_RectMatrix<double,_3U,_3U>).data_[0][lVar6] *
                        (((SquareMatrix<double,_3> *)*padVar5)->super_RectMatrix<double,_3U,_3U>).
                        data_[0][0];
        padVar5 = padVar5 + 1;
      }
      *pdVar1 = dVar7;
      padVar3 = (double (*) [3])(*padVar3 + 1);
    }
    m1 = (SquareMatrix3<double> *)((long)m1 + 0x18);
  }
  return __return_storage_ptr__;
}

Assistant:

inline SquareMatrix3<Real> operator*(const SquareMatrix3<Real>& m1,
                                       const SquareMatrix3<Real>& m2) {
    SquareMatrix3<Real> result;

    for (unsigned int i = 0; i < 3; i++)
      for (unsigned int j = 0; j < 3; j++)
        for (unsigned int k = 0; k < 3; k++)
          result(i, j) += m1(i, k) * m2(k, j);

    return result;
  }